

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::removeSatisfied(Solver *this,vec<unsigned_int> *cs)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  Clause *this_00;
  uint *puVar4;
  vec<unsigned_int> *in_RSI;
  Solver *in_RDI;
  bool in_stack_0000000b;
  CRef in_stack_0000000c;
  Solver *in_stack_00000010;
  Clause *c;
  int j;
  int i;
  Ref in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  int local_18;
  int local_14;
  Solver *this_01;
  
  local_18 = 0;
  this_01 = in_RDI;
  for (local_14 = 0; iVar2 = vec<unsigned_int>::size(in_RSI), local_14 < iVar2;
      local_14 = local_14 + 1) {
    vec<unsigned_int>::operator[](in_RSI,local_14);
    this_00 = ClauseAllocator::operator[]
                        ((ClauseAllocator *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffbc);
    uVar3 = Clause::mark(this_00);
    if (uVar3 != 1) {
      bVar1 = satisfied(this_01,(Clause *)in_RSI);
      if (bVar1) {
        vec<unsigned_int>::operator[](in_RSI,local_14);
        removeSatisfiedClause(in_stack_00000010,in_stack_0000000c,in_stack_0000000b);
      }
      else {
        puVar4 = vec<unsigned_int>::operator[](in_RSI,local_14);
        in_stack_ffffffffffffffc4 = *puVar4;
        puVar4 = vec<unsigned_int>::operator[](in_RSI,local_18);
        *puVar4 = in_stack_ffffffffffffffc4;
        local_18 = local_18 + 1;
      }
    }
  }
  iVar2 = vec<unsigned_int>::size(in_RSI);
  (in_RDI->statistics).solveSteps = (long)iVar2 + (in_RDI->statistics).solveSteps;
  vec<unsigned_int>::shrink(in_RSI,local_14 - local_18);
  return;
}

Assistant:

void Solver::removeSatisfied(vec<CRef> &cs)
{
    int i, j;
    for (i = j = 0; i < cs.size(); i++) {
        Clause &c = ca[cs[i]];
        if (c.mark() == 1) continue;
        if (satisfied(c))
            removeSatisfiedClause(cs[i]);
        else
            cs[j++] = cs[i];
    }
    statistics.solveSteps += cs.size();
    cs.shrink(i - j);
}